

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  ostream *poVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ss;
  int iVar2;
  string *extraout_RAX;
  string *psVar3;
  size_t sVar4;
  size_type sVar5;
  string full_flag;
  char local_51;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  string local_48;
  
  Message::Message((Message *)&local_50);
  ss._M_head_impl = local_50._M_head_impl;
  poVar1 = (ostream *)(local_50._M_head_impl + 0x10);
  sVar4 = 6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"gtest_",6);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar4 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)this,sVar4);
  StringStreamToString(&local_48,ss._M_head_impl);
  if (ss._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)ss._M_head_impl + 8))(ss._M_head_impl);
  }
  Message::Message((Message *)&local_50);
  if (local_48._M_string_length != 0) {
    sVar5 = 0;
    do {
      iVar2 = toupper((uint)(byte)local_48._M_dataplus._M_p[sVar5]);
      local_51 = (char)iVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_50._M_head_impl + 0x10),&local_51,1);
      sVar5 = sVar5 + 1;
    } while (sVar5 != local_48._M_string_length);
  }
  StringStreamToString(__return_storage_ptr__,local_50._M_head_impl);
  if (local_50._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))(local_50._M_head_impl);
  }
  psVar3 = (string *)&local_48.field_2;
  if ((string *)local_48._M_dataplus._M_p != psVar3) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}